

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

Descriptor *
despot::BuildUsage(string *lower_bounds_str,string *base_lower_bounds_str,string *upper_bounds_str,
                  string *base_upper_bounds_str)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *base_upper_bounds_str_local;
  string *upper_bounds_str_local;
  string *base_lower_bounds_str_local;
  string *lower_bounds_str_local;
  
  local_28 = base_upper_bounds_str;
  base_upper_bounds_str_local = upper_bounds_str;
  upper_bounds_str_local = base_lower_bounds_str;
  base_lower_bounds_str_local = lower_bounds_str;
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::lb_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::lb_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_48,"-l <arg>  \t--lbtype <arg>  \tLower bound strategy (",
                     lower_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::lb_str_abi_cxx11_,&local_48,").");
      std::__cxx11::string::~string((string *)&local_48);
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::lb_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::lb_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::blb_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::blb_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_78,"  \t--blbtype <arg>  \tBase lower bound (",base_lower_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::blb_str_abi_cxx11_,&local_78,").");
      std::__cxx11::string::~string((string *)&local_78);
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::blb_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::blb_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::ub_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::ub_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_98,"-u <arg>  \t--ubtype <arg>  \tUpper bound strategy (",
                     upper_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::ub_str_abi_cxx11_,&local_98,").");
      std::__cxx11::string::~string((string *)&local_98);
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::ub_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::ub_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::bub_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::bub_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+(&local_b8,"  \t--bubtype <arg>  \tBase upper bound (",base_upper_bounds_str);
      std::operator+(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                      ::bub_str_abi_cxx11_,&local_b8,").");
      std::__cxx11::string::~string((string *)&local_b8);
      __cxa_atexit(std::__cxx11::string::~string,
                   &BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                    ::bub_str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::bub_str_abi_cxx11_);
    }
  }
  if (BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
      ::usage == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                                 ::usage);
    if (iVar1 != 0) {
      BuildUsage::usage[0].index = 1;
      BuildUsage::usage[0].type = 0;
      BuildUsage::usage[0].shortopt = "";
      BuildUsage::usage[0].longopt = "help";
      BuildUsage::usage[0].check_arg = option::Arg::None;
      BuildUsage::usage[0].help = "  \t--help\tPrint usage and exit.";
      BuildUsage::usage[1].index = 2;
      BuildUsage::usage[1].type = 0;
      BuildUsage::usage[1].shortopt = "m";
      BuildUsage::usage[1].longopt = "model-params";
      BuildUsage::usage[1].check_arg = option::Arg::Required;
      BuildUsage::usage[1].help =
           "-m <arg>  \t--model-params <arg>  \tPath to model-parameters file, if any.";
      BuildUsage::usage[2].index = 3;
      BuildUsage::usage[2].type = 0;
      BuildUsage::usage[2].shortopt = "w";
      BuildUsage::usage[2].longopt = "world-params";
      BuildUsage::usage[2].check_arg = option::Arg::Required;
      BuildUsage::usage[2].help =
           "-w <arg>  \t--world-params <arg>  \tPath to world-parameters file, if any.";
      BuildUsage::usage[3].index = 6;
      BuildUsage::usage[3].type = 0;
      BuildUsage::usage[3].shortopt = "";
      BuildUsage::usage[3].longopt = "size";
      BuildUsage::usage[3].check_arg = option::Arg::Required;
      BuildUsage::usage[3].help = "  \t--size <arg>  \tSize of a problem (problem specific).";
      BuildUsage::usage[4].index = 7;
      BuildUsage::usage[4].type = 0;
      BuildUsage::usage[4].shortopt = "";
      BuildUsage::usage[4].longopt = "number";
      BuildUsage::usage[4].check_arg = option::Arg::Required;
      BuildUsage::usage[4].help =
           "  \t--number <arg>  \tNumber of elements of a problem (problem specific).";
      BuildUsage::usage[5].index = 4;
      BuildUsage::usage[5].type = 0;
      BuildUsage::usage[5].shortopt = "d";
      BuildUsage::usage[5].longopt = "depth";
      BuildUsage::usage[5].check_arg = option::Arg::Required;
      BuildUsage::usage[5].help =
           "-d <arg>  \t--depth <arg>  \tMaximum depth of search tree (default 90).";
      BuildUsage::usage[6].index = 5;
      BuildUsage::usage[6].type = 0;
      BuildUsage::usage[6].shortopt = "g";
      BuildUsage::usage[6].longopt = "discount";
      BuildUsage::usage[6].check_arg = option::Arg::Required;
      BuildUsage::usage[6].help = "-g <arg>  \t--discount <arg>  \tDiscount factor (default 0.95).";
      BuildUsage::usage[7].index = 9;
      BuildUsage::usage[7].type = 0;
      BuildUsage::usage[7].shortopt = "t";
      BuildUsage::usage[7].longopt = "timeout";
      BuildUsage::usage[7].check_arg = option::Arg::Required;
      BuildUsage::usage[7].help =
           "-t <arg>  \t--timeout <arg>  \tSearch time per move, in seconds (default 1).";
      BuildUsage::usage[8].index = 10;
      BuildUsage::usage[8].type = 0;
      BuildUsage::usage[8].shortopt = "n";
      BuildUsage::usage[8].longopt = "nparticles";
      BuildUsage::usage[8].check_arg = option::Arg::Required;
      BuildUsage::usage[8].help =
           "-n <arg>  \t--nparticles <arg>  \tNumber of particles (default 500).";
      BuildUsage::usage[9].index = 0xb;
      BuildUsage::usage[9].type = 0;
      BuildUsage::usage[9].shortopt = "p";
      BuildUsage::usage[9].longopt = "prune";
      BuildUsage::usage[9].check_arg = option::Arg::Required;
      BuildUsage::usage[9].help =
           "-p <arg>  \t--prune <arg>  \tPruning constant (default no pruning).";
      BuildUsage::usage[10].index = 0xc;
      BuildUsage::usage[10].type = 0;
      BuildUsage::usage[10].shortopt = "";
      BuildUsage::usage[10].longopt = "xi";
      BuildUsage::usage[10].check_arg = option::Arg::Required;
      BuildUsage::usage[10].help = "  \t--xi <arg>  \tGap constant (default to 0.95).";
      BuildUsage::usage[0xb].index = 0xf;
      BuildUsage::usage[0xb].type = 0;
      BuildUsage::usage[0xb].shortopt = "";
      BuildUsage::usage[0xb].longopt = "max-policy-simlen";
      BuildUsage::usage[0xb].check_arg = option::Arg::Required;
      BuildUsage::usage[0xb].help =
           "  \t--max-policy-simlen <arg>  \tDepth to simulate the default policy until. (default 90)."
      ;
      BuildUsage::usage[0xc].index = 8;
      BuildUsage::usage[0xc].type = 0;
      BuildUsage::usage[0xc].shortopt = "r";
      BuildUsage::usage[0xc].longopt = "seed";
      BuildUsage::usage[0xc].check_arg = option::Arg::Required;
      BuildUsage::usage[0xc].help =
           "-r <arg>  \t--seed <arg>  \tRandom number seed (default is random).";
      BuildUsage::usage[0xd].index = 0xd;
      BuildUsage::usage[0xd].type = 0;
      BuildUsage::usage[0xd].shortopt = "s";
      BuildUsage::usage[0xd].longopt = "simlen";
      BuildUsage::usage[0xd].check_arg = option::Arg::Required;
      BuildUsage::usage[0xd].help =
           "-s <arg>  \t--simlen <arg>  \tNumber of steps to simulate. (default 90; 0 = infinite).";
      BuildUsage::usage[0xe].index = 0x11;
      BuildUsage::usage[0xe].type = 0;
      BuildUsage::usage[0xe].shortopt = "";
      BuildUsage::usage[0xe].longopt = "runs";
      BuildUsage::usage[0xe].check_arg = option::Arg::Required;
      BuildUsage::usage[0xe].help = "  \t--runs <arg>  \tNumber of runs. (default 1).";
      BuildUsage::usage[0xf].index = 0x13;
      BuildUsage::usage[0xf].type = 0;
      BuildUsage::usage[0xf].shortopt = "l";
      BuildUsage::usage[0xf].longopt = "lbtype";
      BuildUsage::usage[0xf].check_arg = option::Arg::Required;
      BuildUsage::usage[0xf].help = (char *)std::__cxx11::string::c_str();
      BuildUsage::usage[0x10].index = 0x12;
      BuildUsage::usage[0x10].type = 0;
      BuildUsage::usage[0x10].shortopt = "";
      BuildUsage::usage[0x10].longopt = "blbtype";
      BuildUsage::usage[0x10].check_arg = option::Arg::Required;
      BuildUsage::usage[0x10].help = (char *)std::__cxx11::string::c_str();
      BuildUsage::usage[0x11].index = 0x15;
      BuildUsage::usage[0x11].type = 0;
      BuildUsage::usage[0x11].shortopt = "u";
      BuildUsage::usage[0x11].longopt = "ubtype";
      BuildUsage::usage[0x11].check_arg = option::Arg::Required;
      BuildUsage::usage[0x11].help = (char *)std::__cxx11::string::c_str();
      BuildUsage::usage[0x12].index = 0x14;
      BuildUsage::usage[0x12].type = 0;
      BuildUsage::usage[0x12].shortopt = "";
      BuildUsage::usage[0x12].longopt = "bubtype";
      BuildUsage::usage[0x12].check_arg = option::Arg::Required;
      BuildUsage::usage[0x12].help = (char *)std::__cxx11::string::c_str();
      BuildUsage::usage[0x13].index = 0x16;
      BuildUsage::usage[0x13].type = 0;
      BuildUsage::usage[0x13].shortopt = "b";
      BuildUsage::usage[0x13].longopt = "belief";
      BuildUsage::usage[0x13].check_arg = option::Arg::Required;
      BuildUsage::usage[0x13].help =
           "-b <arg>  \t--belief <arg>  \tBelief update strategy, if applicable.";
      BuildUsage::usage[0x14].index = 0x1c;
      BuildUsage::usage[0x14].type = 0;
      BuildUsage::usage[0x14].shortopt = "";
      BuildUsage::usage[0x14].longopt = "noise";
      BuildUsage::usage[0x14].check_arg = option::Arg::Required;
      BuildUsage::usage[0x14].help =
           "  \t--noise <arg>  \tNoise level for transition in POMDPX belief update.";
      BuildUsage::usage[0x15].index = 0x18;
      BuildUsage::usage[0x15].type = 0;
      BuildUsage::usage[0x15].shortopt = "v";
      BuildUsage::usage[0x15].longopt = "verbosity";
      BuildUsage::usage[0x15].check_arg = option::Arg::Required;
      BuildUsage::usage[0x15].help = "-v <arg>  \t--verbosity <arg>  \tVerbosity level.";
      BuildUsage::usage[0x16].index = 0x19;
      BuildUsage::usage[0x16].type = 0;
      BuildUsage::usage[0x16].shortopt = "";
      BuildUsage::usage[0x16].longopt = "silence";
      BuildUsage::usage[0x16].check_arg = option::Arg::None;
      BuildUsage::usage[0x16].help = "  \t--silence  \tReduce default output to minimal.";
      BuildUsage::usage[0x17].index = 0x1a;
      BuildUsage::usage[0x17].type = 0;
      BuildUsage::usage[0x17].shortopt = "";
      BuildUsage::usage[0x17].longopt = "solver";
      BuildUsage::usage[0x17].check_arg = option::Arg::Required;
      BuildUsage::usage[0x17].help = "  \t--solver <arg>  \t";
      BuildUsage::usage[0x18].index = 0x1e;
      BuildUsage::usage[0x18].type = 0;
      BuildUsage::usage[0x18].shortopt = "";
      BuildUsage::usage[0x18].longopt = "prior";
      BuildUsage::usage[0x18].check_arg = option::Arg::Required;
      BuildUsage::usage[0x18].help = "  \t--prior <arg>  \tPOMCP prior.";
      memset(BuildUsage::usage + 0x19,0,0x28);
      __cxa_guard_release(&BuildUsage(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)
                           ::usage);
    }
  }
  return BuildUsage::usage;
}

Assistant:

option::Descriptor* BuildUsage(string lower_bounds_str,
		string base_lower_bounds_str, string upper_bounds_str,
		string base_upper_bounds_str) {
	static string lb_str =
			"-l <arg>  \t--lbtype <arg>  \tLower bound strategy ("
					+ lower_bounds_str + ").";
	static string blb_str = "  \t--blbtype <arg>  \tBase lower bound ("
			+ base_lower_bounds_str + ").";
	static string ub_str =
			"-u <arg>  \t--ubtype <arg>  \tUpper bound strategy ("
					+ upper_bounds_str + ").";
	static string bub_str = "  \t--bubtype <arg>  \tBase upper bound ("
			+ base_upper_bounds_str + ").";
	// option::Arg::Required is a misnomer. The program won't complain if these
	// are absent, and required flags must be checked manually.
	static option::Descriptor usage[] =
			{ { E_HELP, 0, "", "help", option::Arg::None,
					"  \t--help\tPrint usage and exit." },
					{ E_PARAMS_FILE, 0, "m", "model-params",
							option::Arg::Required,
							"-m <arg>  \t--model-params <arg>  \tPath to model-parameters file, if "
									"any." },
					{ E_WORLD_FILE, 0, "w", "world-params",
							option::Arg::Required,
							"-w <arg>  \t--world-params <arg>  \tPath to world-parameters file, if "
									"any." },
					{ E_SIZE, 0, "", "size", option::Arg::Required,
							"  \t--size <arg>  \tSize of a problem (problem specific)." },
					{ E_NUMBER, 0, "", "number", option::Arg::Required,
							"  \t--number <arg>  \tNumber of elements of a problem (problem "
									"specific)." },
					{ E_DEPTH, 0, "d", "depth", option::Arg::Required,
							"-d <arg>  \t--depth <arg>  \tMaximum depth of search tree (default 90)." },
					{ E_DISCOUNT, 0, "g", "discount", option::Arg::Required,
							"-g <arg>  \t--discount <arg>  \tDiscount factor (default 0.95)." },
					{ E_TIMEOUT, 0, "t", "timeout", option::Arg::Required,
							"-t <arg>  \t--timeout <arg>  \tSearch time per move, in seconds (default "
									"1)." },
					{ E_NUMPARTICLES, 0, "n", "nparticles",
							option::Arg::Required,
							"-n <arg>  \t--nparticles <arg>  \tNumber of particles (default 500)." },
					{ E_PRUNE, 0, "p", "prune", option::Arg::Required,
							"-p <arg>  \t--prune <arg>  \tPruning constant (default no pruning)." },
					{ E_GAP, 0, "", "xi", option::Arg::Required,
							"  \t--xi <arg>  \tGap constant (default to 0.95)." },
					{ E_MAX_POLICY_SIM_LEN, 0, "", "max-policy-simlen",
							option::Arg::Required,
							"  \t--max-policy-simlen <arg>  \tDepth to simulate the default policy "
									"until. (default 90)." },

					{ E_SEED, 0, "r", "seed", option::Arg::Required,
							"-r <arg>  \t--seed <arg>  \tRandom number seed (default is random)." },
					{ E_SIM_LEN, 0, "s", "simlen", option::Arg::Required,
							"-s <arg>  \t--simlen <arg>  \tNumber of steps to simulate. (default 90; 0 "
									"= infinite)." },
					{ E_RUNS, 0, "", "runs", option::Arg::Required,
							"  \t--runs <arg>  \tNumber of runs. (default 1)." },
					{ E_LBTYPE, 0, "l", "lbtype", option::Arg::Required,
							lb_str.c_str() }, { E_BLBTYPE, 0, "", "blbtype",
							option::Arg::Required, blb_str.c_str() }, {
							E_UBTYPE, 0, "u", "ubtype", option::Arg::Required,
							ub_str.c_str() }, { E_BUBTYPE, 0, "", "bubtype",
							option::Arg::Required, bub_str.c_str() },
					{ E_BELIEF, 0, "b", "belief", option::Arg::Required,
							"-b <arg>  \t--belief <arg>  \tBelief update strategy, if applicable." },
					{ E_NOISE, 0, "", "noise", option::Arg::Required,
							"  \t--noise <arg>  \tNoise level for transition in POMDPX belief "
									"update." },

					{ E_VERBOSITY, 0, "v", "verbosity", option::Arg::Required,
							"-v <arg>  \t--verbosity <arg>  \tVerbosity level." },
					{ E_SILENCE, 0, "", "silence", option::Arg::None,
							"  \t--silence  \tReduce default output to minimal." },
					{ E_SOLVER, 0, "", "solver", option::Arg::Required,
							"  \t--solver <arg>  \t" }, { E_PRIOR, 0, "",
							"prior", option::Arg::Required,
							"  \t--prior <arg>  \tPOMCP prior." }, { 0, 0, 0, 0,
							0, 0 } };
	return usage;
}